

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprNodeIsConstantFunction(Walker *pWalker,Expr *pExpr)

{
  ExprList *p;
  sqlite3 *db;
  FuncDef *pFVar1;
  int nArg;
  
  nArg = 0;
  if (((pExpr->flags & 0x10000) == 0) && (p = (pExpr->x).pList, nArg = 0, p != (ExprList *)0x0)) {
    nArg = p->nExpr;
    sqlite3WalkExprList(pWalker,p);
    if (pWalker->eCode == 0) {
      return 2;
    }
  }
  db = pWalker->pParse->db;
  pFVar1 = sqlite3FindFunction(db,(pExpr->u).zToken,nArg,db->enc,'\0');
  if ((((pFVar1 != (FuncDef *)0x0) && (pFVar1->xFinalize == (_func_void_sqlite3_context_ptr *)0x0))
      && ((pFVar1->funcFlags & 0x2800) != 0)) && ((pExpr->flags & 0x1000000) == 0)) {
    return 1;
  }
  pWalker->eCode = 0;
  return 2;
}

Assistant:

static SQLITE_NOINLINE int exprNodeIsConstantFunction(
  Walker *pWalker,
  Expr *pExpr
){
  int n;             /* Number of arguments */
  ExprList *pList;   /* List of arguments */
  FuncDef *pDef;     /* The function */
  sqlite3 *db;       /* The database */

  assert( pExpr->op==TK_FUNCTION );
  if( ExprHasProperty(pExpr, EP_TokenOnly)
   || (pList = pExpr->x.pList)==0
  ){;
    n = 0;
  }else{
    n = pList->nExpr;
    sqlite3WalkExprList(pWalker, pList);
    if( pWalker->eCode==0 ) return WRC_Abort;
  }
  db = pWalker->pParse->db;
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, n, ENC(db), 0);
  if( pDef==0
   || pDef->xFinalize!=0
   || (pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG))==0
   || ExprHasProperty(pExpr, EP_WinFunc)
  ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }
  return WRC_Prune;
}